

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundShape.cpp
# Opt level: O1

void __thiscall btCompoundShape::createAabbTreeFromChildren(btCompoundShape *this)

{
  btCompoundShapeChild *pbVar1;
  long *plVar2;
  btDbvt *this_00;
  btDbvtNode *pbVar3;
  long lVar4;
  void *data;
  btVector3 localAabbMax;
  btVector3 localAabbMin;
  btDbvtVolume bounds;
  btScalar local_78 [2];
  btScalar abStack_70 [2];
  btScalar local_68 [2];
  btScalar abStack_60 [2];
  btDbvtVolume local_58;
  
  if (this->m_dynamicAabbTree != (btDbvt *)0x0) {
    return;
  }
  this_00 = (btDbvt *)btAlignedAllocInternal(0x60,0x10);
  btDbvt::btDbvt(this_00);
  this->m_dynamicAabbTree = this_00;
  if (0 < (this->m_children).m_size) {
    lVar4 = 0;
    data = (void *)0x0;
    do {
      pbVar1 = (this->m_children).m_data;
      plVar2 = *(long **)((long)(&pbVar1->m_transform + 1) + lVar4);
      (**(code **)(*plVar2 + 0x10))
                (plVar2,(long)(pbVar1->m_transform).m_basis.m_el[0].m_floats + lVar4,local_68,
                 local_78);
      local_58.mi.m_floats[0] = local_68[0];
      local_58.mi.m_floats[1] = local_68[1];
      local_58.mi.m_floats[2] = abStack_60[0];
      local_58.mi.m_floats[3] = abStack_60[1];
      local_58.mx.m_floats[0] = local_78[0];
      local_58.mx.m_floats[1] = local_78[1];
      local_58.mx.m_floats[2] = abStack_70[0];
      local_58.mx.m_floats[3] = abStack_70[1];
      pbVar3 = btDbvt::insert(this->m_dynamicAabbTree,&local_58,data);
      *(btDbvtNode **)((long)(&pbVar1->m_transform + 1) + lVar4 + 0x10) = pbVar3;
      data = (void *)((long)data + 1);
      lVar4 = lVar4 + 0x58;
    } while ((long)data < (long)(this->m_children).m_size);
  }
  return;
}

Assistant:

void btCompoundShape::createAabbTreeFromChildren()
{
    if ( !m_dynamicAabbTree )
    {
        void* mem = btAlignedAlloc(sizeof(btDbvt),16);
        m_dynamicAabbTree = new(mem) btDbvt();
        btAssert(mem==m_dynamicAabbTree);

        for ( int index = 0; index < m_children.size(); index++ )
        {
            btCompoundShapeChild &child = m_children[index];

            //extend the local aabbMin/aabbMax
            btVector3 localAabbMin,localAabbMax;
            child.m_childShape->getAabb(child.m_transform,localAabbMin,localAabbMax);

            const btDbvtVolume  bounds=btDbvtVolume::FromMM(localAabbMin,localAabbMax);
			size_t index2 = index;
            child.m_node = m_dynamicAabbTree->insert(bounds, reinterpret_cast<void*>(index2) );
        }
    }
}